

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::reserve
          (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *this,size_t n)

{
  double *p;
  ulong uVar1;
  double *pdVar2;
  int i;
  ulong uVar3;
  
  if (this->nAlloc < n) {
    pdVar2 = pmr::polymorphic_allocator<double>::allocate_object<double>(&this->alloc,n);
    p = this->ptr;
    uVar1 = this->nStored;
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      pdVar2[uVar3] = p[uVar3];
    }
    pmr::polymorphic_allocator<double>::deallocate_object<double>(&this->alloc,p,this->nAlloc);
    this->nAlloc = n;
    this->ptr = pdVar2;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }